

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  uint uVar1;
  Fts5Config *pFVar2;
  int iVar3;
  char *z;
  Fts5Colset *pFVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  z = sqlite3Fts5Strndup(&pParse->rc,p->p,p->n);
  if (pParse->rc == 0) {
    pFVar2 = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    uVar5 = pFVar2->nCol;
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = sqlite3_stricmp(pFVar2->azCol[uVar6],z);
      if (iVar3 == 0) {
        uVar8 = uVar6 & 0xffffffff;
        break;
      }
    }
    uVar7 = (uint)uVar8;
    if (uVar7 == uVar5) {
      pFVar4 = (Fts5Colset *)0x0;
      sqlite3Fts5ParseError(pParse,"no such column: %s",z);
    }
    else {
      if (pColset == (Fts5Colset *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = pColset->nCol;
      }
      lVar9 = (long)(int)uVar5;
      pFVar4 = (Fts5Colset *)sqlite3_realloc64(pColset,lVar9 * 4 + 8);
      if (pFVar4 == (Fts5Colset *)0x0) {
        pParse->rc = 7;
        pFVar4 = (Fts5Colset *)0x0;
      }
      else {
        uVar8 = 0;
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          uVar1 = pFVar4->aiCol[uVar8];
          if (uVar1 == uVar7) goto LAB_001baa0f;
          if (uVar1 != uVar7 && (int)uVar7 <= (int)uVar1) {
            uVar6 = uVar8 & 0xffffffff;
            break;
          }
        }
        for (; (int)uVar6 < lVar9; lVar9 = lVar9 + -1) {
          pFVar4->aiCol[lVar9] = pFVar4->aiCol[lVar9 + -1];
        }
        pFVar4->aiCol[(int)uVar6] = uVar7;
        pFVar4->nCol = uVar5 + 1;
      }
    }
LAB_001baa0f:
    sqlite3_free(z);
    if (pFVar4 != (Fts5Colset *)0x0) {
      return pFVar4;
    }
  }
  sqlite3_free(pColset);
  return (Fts5Colset *)0x0;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}